

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void float64_suite::fail_missing_eight(void)

{
  value_type input [1];
  decoder decoder;
  uchar local_41;
  undefined4 local_40;
  value local_3c;
  decoder local_38;
  
  local_38.input._M_str = &local_41;
  local_41 = 0xd7;
  local_38.input._M_len = 1;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_3c = local_38.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3b7,"void float64_suite::fail_missing_eight()",&local_3c,&local_40);
  return;
}

Assistant:

void fail_missing_eight()
{
    const value_type input[] = { token::code::float64 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}